

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# litl_split.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  __parse_args(argc,argv);
  litl_split_archive(__archive_name,__output_dir);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

  // parse the arguments passed to this program
  __parse_args(argc, argv);

  // split the archive
  litl_split_archive(__archive_name, __output_dir);

  return EXIT_SUCCESS;
}